

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

ImDrawIdx * ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx *self,ImDrawIdx *it,ImDrawIdx v)

{
  unsigned_short *puVar1;
  unsigned_short local_2;
  
  puVar1 = ImVector<unsigned_short>::insert(self,it,&local_2);
  return puVar1;
}

Assistant:

CIMGUI_API ImDrawIdx* ImVector_ImDrawIdx_insert(ImVector_ImDrawIdx* self,ImDrawIdx const * it,const ImDrawIdx v)
{
    return self->insert(it,v);
}